

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Buffers::ClearTest::LogFail<signed_char>
          (ClearTest *this,bool use_sub_data,GLenum internalformat,char *data,char *reference,
          GLsizei count)

{
  ostringstream *this_00;
  ulong uVar1;
  GLsizei i;
  ulong uVar2;
  string the_log;
  stringstream number;
  string local_210 [32];
  ClearTest *local_1f0;
  char *local_1e8;
  char *local_1e0;
  string local_1d8 [32];
  undefined1 local_1b8 [16];
  ostream local_1a8;
  
  local_1f0 = this;
  local_1e8 = reference;
  local_1e0 = data;
  std::__cxx11::string::string<std::allocator<char>>
            (local_210,"The test of ",(allocator<char> *)local_1b8);
  std::__cxx11::string::append((char *)local_210);
  std::__cxx11::string::append((char *)local_210);
  uVar1 = 0;
  uVar2 = (ulong)(uint)count;
  if (count < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::operator<<(&local_1a8,local_1e0[uVar1]);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append(local_210);
    std::__cxx11::string::~string(local_1d8);
    if (count - 1 != uVar1) {
      std::__cxx11::string::append((char *)local_210);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  std::__cxx11::string::append((char *)local_210);
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::operator<<(&local_1a8,local_1e8[uVar1]);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append(local_210);
    std::__cxx11::string::~string(local_1d8);
    if (count - 1 != uVar1) {
      std::__cxx11::string::append((char *)local_210);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  std::__cxx11::string::append((char *)local_210);
  local_1b8._0_8_ = ((local_1f0->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,local_210);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::__cxx11::string::~string(local_210);
  return;
}

Assistant:

void ClearTest::LogFail(bool use_sub_data, glw::GLenum internalformat, const T* data, const T* reference,
						const glw::GLsizei count)
{
	(void)internalformat;
	std::string the_log = "The test of ";

	if (use_sub_data)
	{
		the_log.append("ClearNamedBufferSubData has failed for internalformat ");
	}
	else
	{
		the_log.append("ClearNamedBufferData has failed for internalformat ");
	}

	//the_log.append(glu::getPixelFormatName(internalformat));
	the_log.append(". Cleared buffer data is equal to [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << data[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("], but [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << reference[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("] was expected.");

	m_context.getTestContext().getLog() << tcu::TestLog::Message << the_log << tcu::TestLog::EndMessage;
}